

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

Am_Wrapper * quit_or_exit_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_String local_20;
  Am_Object widget;
  Am_Widget_Look look;
  
  pAVar2 = Am_Object::Get(self,0x170,3);
  Am_Object::Am_Object(&widget,pAVar2);
  bVar1 = Am_Object::Valid(&widget);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&widget,0x17f,4);
    Am_Widget_Look::Am_Widget_Look(&look,pAVar2);
    if (look.value == Am_WINDOWS_LOOK.value) {
      Am_String::Am_String(&local_20,"Exit",true);
      pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_20);
      goto LAB_0024367a;
    }
  }
  Am_String::Am_String(&local_20,"Quit",true);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_20);
LAB_0024367a:
  Am_String::~Am_String(&local_20);
  Am_Object::~Am_Object(&widget);
  return pAVar3;
}

Assistant:

Am_Define_String_Formula(quit_or_exit)
{
  Am_Object widget = self.Get(Am_SAVED_OLD_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (widget.Valid()) {
    Am_Widget_Look look = widget.Get(Am_WIDGET_LOOK, Am_NO_DEPENDENCY);
    if (look == Am_WINDOWS_LOOK)
      return Am_String("Exit");
  }
  return Am_String("Quit");
}